

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O0

void R_InstallSprite(int num,spriteframewithrotate *sprtemp,int *maxframe)

{
  WORD WVar1;
  int iVar2;
  FVoxelDef *pFVar3;
  bool bVar4;
  uint uVar5;
  spritedef_t *psVar6;
  spriteframe_t *psVar7;
  FTexture *pFVar8;
  int local_30;
  int local_2c;
  int rot_1;
  int rot;
  int framestart;
  int frame;
  int *maxframe_local;
  spriteframewithrotate *sprtemp_local;
  int num_local;
  
  if (*maxframe == -1) {
    psVar6 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)num);
    psVar6->numframes = '\0';
  }
  else {
    *maxframe = *maxframe + 1;
    for (rot = 0; rot < *maxframe; rot = rot + 1) {
      iVar2 = *(int *)&sprtemp[rot].super_spriteframe_t.field_0x4c;
      if (iVar2 != -1) {
        if (iVar2 == 0) {
          for (local_2c = 1; local_2c < 0x10; local_2c = local_2c + 1) {
            sprtemp[rot].super_spriteframe_t.Texture[local_2c].texnum =
                 sprtemp[rot].super_spriteframe_t.Texture[0].texnum;
          }
          if ((sprtemp[rot].super_spriteframe_t.Flip & 1) != 0) {
            sprtemp[rot].super_spriteframe_t.Flip = 0xffff;
          }
        }
        else if (iVar2 == 1) {
          for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
            bVar4 = FTextureID::isValid(sprtemp[rot].super_spriteframe_t.Texture +
                                        (local_2c * 2 + 1));
            if ((!bVar4) &&
               (sprtemp[rot].super_spriteframe_t.Texture[local_2c * 2 + 1].texnum =
                     sprtemp[rot].super_spriteframe_t.Texture[local_2c << 1].texnum,
               ((uint)sprtemp[rot].super_spriteframe_t.Flip & 1 << ((byte)(local_2c << 1) & 0x1f))
               != 0)) {
              sprtemp[rot].super_spriteframe_t.Flip =
                   sprtemp[rot].super_spriteframe_t.Flip |
                   (ushort)(1 << ((char)(local_2c << 1) + 1U & 0x1f));
            }
            bVar4 = FTextureID::isValid(sprtemp[rot].super_spriteframe_t.Texture + (local_2c << 1));
            if ((!bVar4) &&
               (sprtemp[rot].super_spriteframe_t.Texture[local_2c << 1].texnum =
                     sprtemp[rot].super_spriteframe_t.Texture[local_2c * 2 + 1].texnum,
               ((uint)sprtemp[rot].super_spriteframe_t.Flip &
               1 << ((char)(local_2c << 1) + 1U & 0x1f)) != 0)) {
              sprtemp[rot].super_spriteframe_t.Flip =
                   sprtemp[rot].super_spriteframe_t.Flip |
                   (ushort)(1 << ((byte)(local_2c << 1) & 0x1f));
            }
          }
          for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
            bVar4 = FTextureID::isValid(sprtemp[rot].super_spriteframe_t.Texture + local_2c);
            if (!bVar4) {
              psVar6 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)num);
              I_FatalError("R_InstallSprite: Sprite %s frame %c is missing rotations",psVar6,
                           (ulong)(rot + 0x41));
            }
          }
        }
      }
    }
    for (rot = 0; rot < *maxframe; rot = rot + 1) {
      if (*(int *)&sprtemp[rot].super_spriteframe_t.field_0x4c == -1) {
        memset(sprtemp[rot].super_spriteframe_t.Texture,0,0x40);
        sprtemp[rot].super_spriteframe_t.Flip = 0;
        *(undefined4 *)&sprtemp[rot].super_spriteframe_t.field_0x4c = 0;
      }
    }
    iVar2 = *maxframe;
    psVar6 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)num);
    psVar6->numframes = (BYTE)iVar2;
    uVar5 = TArray<spriteframe_t,_spriteframe_t>::Reserve(&SpriteFrames,*maxframe);
    psVar6 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)num);
    psVar6->spriteframes = (WORD)uVar5;
    for (rot = 0; rot < *maxframe; rot = rot + 1) {
      psVar7 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                         (&SpriteFrames,(long)(int)(uVar5 + rot));
      memcpy(psVar7->Texture,sprtemp[rot].super_spriteframe_t.Texture,0x40);
      WVar1 = sprtemp[rot].super_spriteframe_t.Flip;
      psVar7 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                         (&SpriteFrames,(long)(int)(uVar5 + rot));
      psVar7->Flip = WVar1;
      pFVar3 = sprtemp[rot].super_spriteframe_t.Voxel;
      psVar7 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                         (&SpriteFrames,(long)(int)(uVar5 + rot));
      psVar7->Voxel = pFVar3;
    }
    for (rot = 0; rot < *maxframe; rot = rot + 1) {
      if (*(int *)&sprtemp[rot].super_spriteframe_t.field_0x4c == 1) {
        for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
          pFVar8 = FTextureManager::operator[]
                             (&TexMan,(FTextureID)
                                      sprtemp[rot].super_spriteframe_t.Texture[local_30].texnum);
          pFVar8->Rotations = (WORD)uVar5 + (short)rot;
        }
      }
    }
  }
  return;
}

Assistant:

static void R_InstallSprite (int num, spriteframewithrotate *sprtemp, int &maxframe)
{
	int frame;
	int framestart;
	int rot;
//	int undefinedFix;

	if (maxframe == -1)
	{
		sprites[num].numframes = 0;
		return;
	}

	maxframe++;

	// [RH] If any frames are undefined, but there are some defined frames, map
	// them to the first defined frame. This is a fix for Doom Raider, which actually
	// worked with ZDoom 2.0.47, because of a bug here. It does not define frames A,
	// B, or C for the sprite PSBG, but because I had sprtemp[].rotate defined as a
	// bool, this code never detected that it was not actually present. After switching
	// to the unified texture system, this caused it to crash while loading the wad.

// [RH] Let undefined frames actually be blank because LWM uses this in at least
// one of her wads.
//	for (frame = 0; frame < maxframe && sprtemp[frame].rotate == -1; ++frame)
//	{ }
//
//	undefinedFix = frame;

	for (frame = 0; frame < maxframe; ++frame)
	{
		switch (sprtemp[frame].rotate)
		{
		case -1:
			// no rotations were found for that frame at all
			//I_FatalError ("R_InstallSprite: No patches found for %s frame %c", sprites[num].name, frame+'A');
			break;
			
		case 0:
			// only the first rotation is needed
			for (rot = 1; rot < 16; ++rot)
			{
				sprtemp[frame].Texture[rot] = sprtemp[frame].Texture[0];
			}
			// If the frame is flipped, they all should be
			if (sprtemp[frame].Flip & 1)
			{
				sprtemp[frame].Flip = 0xFFFF;
			}
			break;
					
		case 1:
			// must have all 8 frame pairs
			for (rot = 0; rot < 8; ++rot)
			{
				if (!sprtemp[frame].Texture[rot*2+1].isValid())
				{
					sprtemp[frame].Texture[rot*2+1] = sprtemp[frame].Texture[rot*2];
					if (sprtemp[frame].Flip & (1 << (rot*2)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2+1);
					}
				}
				if (!sprtemp[frame].Texture[rot*2].isValid())
				{
					sprtemp[frame].Texture[rot*2] = sprtemp[frame].Texture[rot*2+1];
					if (sprtemp[frame].Flip & (1 << (rot*2+1)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2);
					}
				}

			}
			for (rot = 0; rot < 16; ++rot)
			{
				if (!sprtemp[frame].Texture[rot].isValid())
					I_FatalError ("R_InstallSprite: Sprite %s frame %c is missing rotations",
									sprites[num].name, frame+'A');
			}
			break;
		}
	}

	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == -1)
		{
			memset (&sprtemp[frame].Texture, 0, sizeof(sprtemp[0].Texture));
			sprtemp[frame].Flip = 0;
			sprtemp[frame].rotate = 0;
		}
	}
	
	// allocate space for the frames present and copy sprtemp to it
	sprites[num].numframes = maxframe;
	sprites[num].spriteframes = WORD(framestart = SpriteFrames.Reserve (maxframe));
	for (frame = 0; frame < maxframe; ++frame)
	{
		memcpy (SpriteFrames[framestart+frame].Texture, sprtemp[frame].Texture, sizeof(sprtemp[frame].Texture));
		SpriteFrames[framestart+frame].Flip = sprtemp[frame].Flip;
		SpriteFrames[framestart+frame].Voxel = sprtemp[frame].Voxel;
	}

	// Let the textures know about the rotations
	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == 1)
		{
			for (int rot = 0; rot < 16; ++rot)
			{
				TexMan[sprtemp[frame].Texture[rot]]->Rotations = framestart + frame;
			}
		}
	}
}